

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tracks::Write(Tracks *this,IMkvWriter *writer)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  Track *pTVar4;
  ulong uVar5;
  ulong uVar6;
  uint64 size;
  bool bVar7;
  
  uVar1 = this->track_entries_size_;
  uVar5 = (ulong)(int)uVar1;
  bVar7 = 0 < (long)uVar5;
  if ((long)uVar5 < 1) {
    size = 0;
  }
  else {
    uVar6 = 0;
    size = 0;
    do {
      if (this->track_entries_ == (Track **)0x0) {
        pTVar4 = (Track *)0x0;
      }
      else {
        pTVar4 = (Track *)0x0;
        if (uVar6 < this->track_entries_size_) {
          pTVar4 = this->track_entries_[uVar6];
        }
      }
      if (pTVar4 == (Track *)0x0) break;
      iVar2 = (*pTVar4->_vptr_Track[4])(pTVar4);
      size = size + CONCAT44(extraout_var,iVar2);
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < uVar5;
    } while (uVar6 != uVar5);
  }
  if ((!bVar7) && (bVar7 = WriteEbmlMasterElement(writer,0x1654ae6b,size), bVar7)) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    if (-1 < extraout_var_00) {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          iVar3 = (*this->track_entries_[uVar6]->_vptr_Track[5])(this->track_entries_[uVar6],writer)
          ;
          if ((char)iVar3 == '\0') {
            return false;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var_01) {
        if (CONCAT44(extraout_var_01,iVar3) - CONCAT44(extraout_var_00,iVar2) == size) {
          this->wrote_tracks_ = true;
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool Tracks::Write(IMkvWriter* writer) const {
  uint64_t size = 0;
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);

    if (!track)
      return false;

    size += track->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTracks, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < count; ++i) {
    const Track* const track = GetTrackByIndex(i);
    if (!track->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  wrote_tracks_ = true;
  return true;
}